

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::type_caster_holder<Job,_std::shared_ptr<Job>_>::load
          (type_caster_holder<Job,_std::shared_ptr<Job>_> *this,handle src,bool convert,
          PyTypeObject *tobj)

{
  _func__object_ptr__object_ptr__typeobject_ptr *p_Var1;
  byte bVar2;
  type_caster_holder<Job,_std::shared_ptr<Job>_> *src_00;
  bool bVar3;
  bool bVar4;
  int iVar5;
  internals *piVar6;
  vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
  *this_00;
  PyObject **ppPVar7;
  _object *ptr;
  handle local_118;
  object local_110;
  reference local_108;
  _func__object_ptr__object_ptr__typeobject_ptr **converter;
  const_iterator __end0;
  const_iterator __begin0;
  vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
  *__range4;
  handle hStack_d0;
  bool result;
  handle parent;
  undefined1 local_c0 [8];
  iterator __end5;
  undefined1 local_98 [8];
  iterator __begin5;
  tuple *__range5;
  tuple local_70;
  tuple parents;
  PyTypeObject *local_60;
  _Node_iterator_base<std::pair<const_void_*const,_void_*>,_false> local_58;
  byte local_49;
  unordered_map<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
  *puStack_48;
  bool new_style_class;
  unordered_map<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
  *type_dict;
  type_caster_holder<Job,_std::shared_ptr<Job>_> *local_38;
  PyTypeObject *local_30;
  PyTypeObject *tobj_local;
  type_caster_holder<Job,_std::shared_ptr<Job>_> *ptStack_20;
  bool convert_local;
  type_caster_holder<Job,_std::shared_ptr<Job>_> *this_local;
  handle src_local;
  
  local_30 = tobj;
  tobj_local._7_1_ = convert;
  ptStack_20 = this;
  this_local = (type_caster_holder<Job,_std::shared_ptr<Job>_> *)src.m_ptr;
  bVar3 = handle::operator_cast_to_bool((handle *)&this_local);
  if ((bVar3) &&
     ((this->super_type_caster_base<Job>).super_type_caster_generic.typeinfo != (type_info *)0x0)) {
    bVar3 = object_api<pybind11::handle>::is_none((object_api<pybind11::handle> *)&this_local);
    if (bVar3) {
      (this->super_type_caster_base<Job>).super_type_caster_generic.value = (void *)0x0;
      src_local.m_ptr._7_1_ = 1;
    }
    else {
      if ((((this->super_type_caster_base<Job>).super_type_caster_generic.typeinfo)->simple_type &
          1U) == 0) {
        if (local_30 ==
            ((this->super_type_caster_base<Job>).super_type_caster_generic.typeinfo)->type) {
          type_dict = (unordered_map<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
                       *)this_local;
          src_local.m_ptr._7_1_ = load_value_and_holder(this,(handle)this_local);
          goto LAB_00121bdc;
        }
        piVar6 = get_internals();
        puStack_48 = &piVar6->registered_types_py;
        iVar5 = _PyType_Check((PyObject *)local_30);
        local_49 = iVar5 != 0;
        local_60 = local_30;
        local_58._M_cur =
             (__node_type *)
             std::
             unordered_map<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
             ::find(puStack_48,&local_60);
        parents.super_object.super_handle.m_ptr =
             (object)std::
                     unordered_map<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
                     ::end(puStack_48);
        bVar4 = std::__detail::operator==
                          (&local_58,
                           (_Node_iterator_base<std::pair<const_void_*const,_void_*>,_false> *)
                           &parents);
        bVar3 = false;
        if ((bVar4) && (bVar3 = false, (local_49 & 1) != 0)) {
          bVar3 = local_30->tp_bases != (PyObject *)0x0;
        }
        if (bVar3) {
          handle::handle((handle *)&__range5,local_30->tp_bases);
          reinterpret_borrow<pybind11::tuple>((pybind11 *)&local_70,(handle)__range5);
          __begin5._16_8_ = (pybind11 *)&local_70;
          object_api<pybind11::handle>::begin
                    ((iterator *)local_98,(object_api<pybind11::handle> *)&local_70);
          object_api<pybind11::handle>::end
                    ((iterator *)local_c0,(object_api<pybind11::handle> *)__begin5._16_8_);
          while (bVar3 = iterator::operator!=((iterator *)local_98,(iterator *)local_c0), bVar3) {
            hStack_d0 = iterator::operator*((iterator *)local_98);
            src_00 = this_local;
            bVar2 = tobj_local._7_1_;
            ppPVar7 = handle::ptr(&stack0xffffffffffffff30);
            bVar3 = load(this,(handle)src_00,(bool)(bVar2 & 1),(PyTypeObject *)*ppPVar7);
            if (bVar3) {
              src_local.m_ptr._7_1_ = 1;
              parent.m_ptr._4_4_ = 1;
              goto LAB_00121a0a;
            }
            iterator::operator++((iterator *)local_98);
          }
          parent.m_ptr._4_4_ = 2;
LAB_00121a0a:
          iterator::~iterator((iterator *)local_c0);
          iterator::~iterator((iterator *)local_98);
          if (parent.m_ptr._4_4_ == 2) {
            parent.m_ptr._4_4_ = 0;
          }
          tuple::~tuple(&local_70);
          if (parent.m_ptr._4_4_ != 0) goto LAB_00121bdc;
        }
        bVar3 = try_implicit_casts<std::shared_ptr<Job>,_0>
                          (this,(handle)this_local,(bool)(tobj_local._7_1_ & 1));
        if (bVar3) {
          src_local.m_ptr._7_1_ = 1;
          goto LAB_00121bdc;
        }
      }
      else {
        iVar5 = PyType_IsSubtype(local_30,((this->super_type_caster_base<Job>).
                                           super_type_caster_generic.typeinfo)->type);
        if (iVar5 != 0) {
          local_38 = this_local;
          src_local.m_ptr._7_1_ = load_value_and_holder(this,(handle)this_local);
          goto LAB_00121bdc;
        }
      }
      if ((tobj_local._7_1_ & 1) != 0) {
        this_00 = &((this->super_type_caster_base<Job>).super_type_caster_generic.typeinfo)->
                   implicit_conversions;
        __end0 = std::
                 vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                 ::begin(this_00);
        converter = (_func__object_ptr__object_ptr__typeobject_ptr **)
                    std::
                    vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                    ::end(this_00);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end0,(__normal_iterator<_object_*(*const_*)(_object_*,__typeobject_*),_std::vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>_>
                                           *)&converter), bVar3) {
          local_108 = __gnu_cxx::
                      __normal_iterator<_object_*(*const_*)(_object_*,__typeobject_*),_std::vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>_>
                      ::operator*(&__end0);
          p_Var1 = *local_108;
          ppPVar7 = handle::ptr((handle *)&this_local);
          ptr = (*p_Var1)(*ppPVar7,((this->super_type_caster_base<Job>).super_type_caster_generic.
                                   typeinfo)->type);
          handle::handle(&local_118,ptr);
          reinterpret_steal<pybind11::object>((pybind11 *)&local_110,local_118);
          object::operator=(&(this->super_type_caster_base<Job>).super_type_caster_generic.temp,
                            &local_110);
          object::~object(&local_110);
          bVar3 = load(this,(this->super_type_caster_base<Job>).super_type_caster_generic.temp.
                            super_handle.m_ptr,false);
          if (bVar3) {
            src_local.m_ptr._7_1_ = 1;
            goto LAB_00121bdc;
          }
          __gnu_cxx::
          __normal_iterator<_object_*(*const_*)(_object_*,__typeobject_*),_std::vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>_>
          ::operator++(&__end0);
        }
      }
      src_local.m_ptr._7_1_ = 0;
    }
  }
  else {
    src_local.m_ptr._7_1_ = 0;
  }
LAB_00121bdc:
  return (bool)(src_local.m_ptr._7_1_ & 1);
}

Assistant:

bool load(handle src, bool convert, PyTypeObject *tobj) {
        if (!src || !typeinfo)
            return false;
        if (src.is_none()) {
            value = nullptr;
            return true;
        }

        if (typeinfo->simple_type) { /* Case 1: no multiple inheritance etc. involved */
            /* Check if we can safely perform a reinterpret-style cast */
            if (PyType_IsSubtype(tobj, typeinfo->type))
                return load_value_and_holder(src);
        } else { /* Case 2: multiple inheritance */
            /* Check if we can safely perform a reinterpret-style cast */
            if (tobj == typeinfo->type)
                return load_value_and_holder(src);

            /* If this is a python class, also check the parents recursively */
            auto const &type_dict = get_internals().registered_types_py;
            bool new_style_class = PyType_Check((PyObject *) tobj);
            if (type_dict.find(tobj) == type_dict.end() && new_style_class && tobj->tp_bases) {
                auto parents = reinterpret_borrow<tuple>(tobj->tp_bases);
                for (handle parent : parents) {
                    bool result = load(src, convert, (PyTypeObject *) parent.ptr());
                    if (result)
                        return true;
                }
            }

            if (try_implicit_casts(src, convert))
                return true;
        }

        if (convert) {
            for (auto &converter : typeinfo->implicit_conversions) {
                temp = reinterpret_steal<object>(converter(src.ptr(), typeinfo->type));
                if (load(temp, false))
                    return true;
            }
        }

        return false;
    }